

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl2.cpp
# Opt level: O0

void E64::sdl2_wait_until_q_released(void)

{
  bool wait;
  SDL_Event event;
  int local_4c;
  duration<long,std::ratio<1l,1000000l>> local_48 [15];
  byte local_39;
  int local_38 [5];
  int local_24;
  duration<long,_std::ratio<1L,_1000000L>_> *in_stack_ffffffffffffffe0;
  
  local_39 = 1;
  while ((local_39 & 1) != 0) {
    SDL_PollEvent(local_38);
    if ((local_38[0] == 0x301) && (local_24 == 0x71)) {
      local_39 = 0;
    }
    local_4c = 40000;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_48,&local_4c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void E64::sdl2_wait_until_q_released()
{
    SDL_Event event;
    bool wait = true;
    while(wait) {
        SDL_PollEvent(&event);
        if( (event.type == SDL_KEYUP) && (event.key.keysym.sym == SDLK_q) ) wait = false;
        std::this_thread::sleep_for(std::chrono::microseconds(40000));
    }
}